

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void dequantize_row_iq3_xxs(block_iq3_xxs *x,float *y,int64_t k)

{
  float fVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined8 uVar11;
  ulong uVar12;
  undefined6 uVar13;
  undefined1 auVar14 [13];
  undefined1 auVar15 [14];
  undefined1 auVar16 [12];
  unkbyte10 Var17;
  undefined1 auVar18 [13];
  long lVar19;
  long lVar20;
  uint8_t *puVar21;
  long lVar22;
  uint8_t *puVar23;
  uint8_t *puVar24;
  int ib32;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar31;
  uint uVar32;
  uint uVar48;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar43 [16];
  undefined1 auVar46 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [12];
  undefined1 auVar29 [16];
  undefined2 uVar30;
  undefined1 auVar36 [16];
  undefined1 auVar33 [12];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar44 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar54 [16];
  
  lVar19 = k + 0xff;
  if (-1 < k) {
    lVar19 = k;
  }
  if (0xff < k) {
    puVar21 = x->qs + 1;
    lVar22 = 0;
    auVar26._4_8_ = 0x404040402020202;
    auVar26._0_4_ = 0x1010101;
    auVar26._12_4_ = 0;
    auVar27 = ZEXT416(0x80402010);
    uVar30 = CONCAT11(auVar27[3],auVar27[3]);
    uVar11 = CONCAT35(CONCAT21(uVar30,auVar27[2]),CONCAT14(auVar27[2],0x80402010));
    uVar13 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),auVar27[1]),auVar27[1]);
    auVar27._0_2_ = CONCAT11(auVar27[0],auVar27[0]);
    uVar12 = CONCAT62(uVar13,auVar27._0_2_);
    auVar29._8_4_ = 0;
    auVar29._0_8_ = uVar12;
    auVar29._12_2_ = uVar30;
    auVar29._14_2_ = uVar30;
    uVar30 = (undefined2)((ulong)uVar11 >> 0x20);
    auVar28._12_4_ = auVar29._12_4_;
    auVar28._8_2_ = 0;
    auVar28._0_8_ = uVar12;
    auVar28._10_2_ = uVar30;
    auVar34._10_6_ = auVar28._10_6_;
    auVar34._8_2_ = uVar30;
    auVar34._0_8_ = uVar12;
    uVar30 = (undefined2)uVar13;
    auVar27._8_8_ = auVar34._8_8_;
    auVar27._6_2_ = uVar30;
    auVar27._4_2_ = uVar30;
    auVar27._2_2_ = auVar27._0_2_;
    do {
      fVar1 = ggml_table_f32_f16[x[lVar22].d];
      lVar25 = 0;
      puVar24 = puVar21;
      do {
        uVar3 = *(uint *)(x[lVar22].qs + lVar25 * 4 + 0x40);
        fVar31 = ((float)(uVar3 >> 0x1c) + 0.5) * fVar1 * 0.5;
        lVar20 = 0;
        puVar23 = puVar24;
        do {
          bVar2 = *puVar23;
          auVar34 = ZEXT216(CONCAT11(""[uVar3 >> ((byte)lVar20 & 0x1f) & 0x7f],
                                     ""[uVar3 >> ((byte)lVar20 & 0x1f) & 0x7f]));
          auVar34 = pshuflw(auVar34,auVar34,0);
          uVar4 = iq3xxs_grid[puVar23[-1]];
          uVar12 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
          auVar5._8_4_ = 0;
          auVar5._0_8_ = uVar12;
          auVar5[0xc] = (char)(uVar4 >> 0x18);
          auVar6[8] = (char)(uVar4 >> 0x10);
          auVar6._0_8_ = uVar12;
          auVar6[9] = 0;
          auVar6._10_3_ = auVar5._10_3_;
          auVar14._5_8_ = 0;
          auVar14._0_5_ = auVar6._8_5_;
          auVar7[4] = (char)(uVar4 >> 8);
          auVar7._0_4_ = (int)uVar12;
          auVar7[5] = 0;
          auVar7._6_7_ = SUB137(auVar14 << 0x40,6);
          fVar49 = (float)(int)uVar12 * fVar31;
          fVar50 = (float)auVar7._4_4_ * fVar31;
          fVar51 = (float)auVar6._8_4_ * fVar31;
          fVar52 = (float)(uint3)(auVar5._10_3_ >> 0x10) * fVar31;
          auVar42._0_14_ = auVar34._0_14_;
          auVar42[0xe] = auVar34[7];
          auVar42[0xf] = auVar34[7];
          auVar41._14_2_ = auVar42._14_2_;
          auVar41._0_13_ = auVar34._0_13_;
          auVar41[0xd] = auVar34[6];
          auVar40._13_3_ = auVar41._13_3_;
          auVar40._0_12_ = auVar34._0_12_;
          auVar40[0xc] = auVar34[6];
          auVar39._12_4_ = auVar40._12_4_;
          auVar39._0_11_ = auVar34._0_11_;
          auVar39[0xb] = auVar34[5];
          auVar38._11_5_ = auVar39._11_5_;
          auVar38._0_10_ = auVar34._0_10_;
          auVar38[10] = auVar34[5];
          auVar37._10_6_ = auVar38._10_6_;
          auVar37._0_9_ = auVar34._0_9_;
          auVar37[9] = auVar34[4];
          auVar36._9_7_ = auVar37._9_7_;
          auVar36._0_8_ = auVar34._0_8_;
          auVar36[8] = auVar34[4];
          Var17 = CONCAT91(CONCAT81(auVar36._8_8_,auVar34[3]),auVar34[3]);
          auVar16._2_10_ = Var17;
          auVar16[1] = auVar34[2];
          auVar16[0] = auVar34[2];
          auVar15._2_12_ = auVar16;
          auVar15[1] = auVar34[1];
          auVar15[0] = auVar34[1];
          auVar35._0_2_ = CONCAT11(auVar34[0],auVar34[0]);
          auVar35._2_14_ = auVar15;
          uVar30 = (undefined2)Var17;
          auVar45._0_12_ = auVar35._0_12_;
          auVar45._12_2_ = uVar30;
          auVar45._14_2_ = uVar30;
          auVar44._12_4_ = auVar45._12_4_;
          auVar44._0_10_ = auVar35._0_10_;
          auVar44._10_2_ = auVar16._0_2_;
          auVar43._10_6_ = auVar44._10_6_;
          auVar43._0_8_ = auVar35._0_8_;
          auVar43._8_2_ = auVar16._0_2_;
          auVar46._8_8_ = auVar43._8_8_;
          auVar46._6_2_ = auVar15._0_2_;
          auVar46._4_2_ = auVar15._0_2_;
          auVar46._2_2_ = auVar35._0_2_;
          auVar46._0_2_ = auVar35._0_2_;
          auVar34 = auVar26 & auVar46;
          uVar32 = CONCAT13(-(auVar34[3] == '\0'),
                            CONCAT12(-(auVar34[2] == '\0'),
                                     CONCAT11(-(auVar34[1] == '\0'),-(auVar34[0] == '\0'))));
          auVar53._0_8_ =
               CONCAT17(-(auVar34[7] == '\0'),
                        CONCAT16(-(auVar34[6] == '\0'),
                                 CONCAT15(-(auVar34[5] == '\0'),
                                          CONCAT14(-(auVar34[4] == '\0'),uVar32))));
          auVar53[8] = -(auVar34[8] == '\0');
          auVar53[9] = -(auVar34[9] == '\0');
          auVar53[10] = -(auVar34[10] == '\0');
          auVar53[0xb] = -(auVar34[0xb] == '\0');
          auVar54[0xc] = -(auVar34[0xc] == '\0');
          auVar54._0_12_ = auVar53;
          auVar54[0xd] = -(auVar34[0xd] == '\0');
          auVar54[0xe] = -(auVar34[0xe] == '\0');
          auVar54[0xf] = -(auVar34[0xf] == '\0');
          uVar48 = (uint)((ulong)auVar53._0_8_ >> 0x20);
          *y = (float)(~uVar32 & (uint)-fVar49 | (uint)fVar49 & uVar32);
          y[1] = (float)(~uVar48 & (uint)-fVar50 | (uint)fVar50 & uVar48);
          y[2] = (float)(~auVar53._8_4_ & (uint)-fVar51 | (uint)fVar51 & auVar53._8_4_);
          y[3] = (float)(~auVar54._12_4_ & (uint)-fVar52 | (uint)fVar52 & auVar54._12_4_);
          uVar4 = iq3xxs_grid[bVar2];
          uVar12 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
          auVar8._8_4_ = 0;
          auVar8._0_8_ = uVar12;
          auVar8[0xc] = (char)(uVar4 >> 0x18);
          auVar9[8] = (char)(uVar4 >> 0x10);
          auVar9._0_8_ = uVar12;
          auVar9[9] = 0;
          auVar9._10_3_ = auVar8._10_3_;
          auVar18._5_8_ = 0;
          auVar18._0_5_ = auVar9._8_5_;
          auVar10[4] = (char)(uVar4 >> 8);
          auVar10._0_4_ = (int)uVar12;
          auVar10[5] = 0;
          auVar10._6_7_ = SUB137(auVar18 << 0x40,6);
          fVar49 = (float)(int)uVar12 * fVar31;
          fVar50 = (float)auVar10._4_4_ * fVar31;
          fVar51 = (float)auVar9._8_4_ * fVar31;
          fVar52 = (float)(uint3)(auVar8._10_3_ >> 0x10) * fVar31;
          auVar46 = auVar46 & auVar27;
          uVar32 = CONCAT13(-(auVar46[3] == '\0'),
                            CONCAT12(-(auVar46[2] == '\0'),
                                     CONCAT11(-(auVar46[1] == '\0'),-(auVar46[0] == '\0'))));
          auVar33._0_8_ =
               CONCAT17(-(auVar46[7] == '\0'),
                        CONCAT16(-(auVar46[6] == '\0'),
                                 CONCAT15(-(auVar46[5] == '\0'),
                                          CONCAT14(-(auVar46[4] == '\0'),uVar32))));
          auVar33[8] = -(auVar46[8] == '\0');
          auVar33[9] = -(auVar46[9] == '\0');
          auVar33[10] = -(auVar46[10] == '\0');
          auVar33[0xb] = -(auVar46[0xb] == '\0');
          auVar47[0xc] = -(auVar46[0xc] == '\0');
          auVar47._0_12_ = auVar33;
          auVar47[0xd] = -(auVar46[0xd] == '\0');
          auVar47[0xe] = -(auVar46[0xe] == '\0');
          auVar47[0xf] = -(auVar46[0xf] == '\0');
          uVar48 = (uint)((ulong)auVar33._0_8_ >> 0x20);
          y[4] = (float)(~uVar32 & (uint)-fVar49 | (uint)fVar49 & uVar32);
          y[5] = (float)(~uVar48 & (uint)-fVar50 | (uint)fVar50 & uVar48);
          y[6] = (float)(~auVar33._8_4_ & (uint)-fVar51 | (uint)fVar51 & auVar33._8_4_);
          y[7] = (float)(~auVar47._12_4_ & (uint)-fVar52 | (uint)fVar52 & auVar47._12_4_);
          y = y + 8;
          lVar20 = lVar20 + 7;
          puVar23 = puVar23 + 2;
        } while (lVar20 != 0x1c);
        lVar25 = lVar25 + 1;
        puVar24 = puVar24 + 8;
      } while (lVar25 != 8);
      lVar22 = lVar22 + 1;
      puVar21 = puVar21 + 0x62;
    } while (lVar22 != lVar19 >> 8);
  }
  return;
}

Assistant:

void dequantize_row_iq3_xxs(const block_iq3_xxs * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    uint32_t aux32;

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);
        const uint8_t * qs = x[i].qs;
        const uint8_t * scales_and_signs = qs + QK_K/4;

        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            memcpy(&aux32, scales_and_signs + 4*ib32, sizeof(uint32_t));
            const float db = d * (0.5f + (aux32 >> 28)) * 0.5f;
            for (int l = 0; l < 4; ++l) {
                const uint8_t  signs = ksigns_iq2xs[(aux32 >> 7*l) & 127];
                const uint8_t * grid1 = (const uint8_t *)(iq3xxs_grid + qs[2*l+0]);
                const uint8_t * grid2 = (const uint8_t *)(iq3xxs_grid + qs[2*l+1]);
                for (int j = 0; j < 4; ++j) {
                    y[j+0] = db * grid1[j] * (signs & kmask_iq2xs[j+0] ? -1.f : 1.f);
                    y[j+4] = db * grid2[j] * (signs & kmask_iq2xs[j+4] ? -1.f : 1.f);
                }
                y += 8;
            }
            qs += 8;
        }
    }
}